

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O2

void phyr::ParallelFor(function<void_(long)> *func,int64_t count,int chunkSize)

{
  _Manager_type p_Var1;
  int64_t index;
  int64_t __args;
  long lVar2;
  unique_lock<std::mutex> lock;
  ParallelForLoop loop;
  unique_lock<std::mutex> uStack_c8;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type local_a0;
  ParallelForLoop local_98;
  
  if ((count < chunkSize) || (threads == DAT_0019bc38)) {
    lVar2 = 0;
    if (count < 1) {
      count = lVar2;
    }
    for (; count != lVar2; lVar2 = lVar2 + 1) {
      std::function<void_(long)>::operator()(func,lVar2);
    }
  }
  else {
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_a8 = (_Manager_type)0x0;
    local_a0 = func->_M_invoker;
    p_Var1 = (func->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_b8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor
      ;
      local_b8._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
      (func->super__Function_base)._M_manager = (_Manager_type)0x0;
      func->_M_invoker = (_Invoker_type)0x0;
      local_a8 = p_Var1;
    }
    ParallelForLoop::ParallelForLoop(&local_98,(function<void_(long)> *)&local_b8,count,chunkSize);
    std::_Function_base::~_Function_base((_Function_base *)&local_b8);
    std::mutex::lock((mutex *)workListMutex);
    local_98.next = workList;
    workList = &local_98;
    pthread_mutex_unlock((pthread_mutex_t *)workListMutex);
    std::unique_lock<std::mutex>::unique_lock(&uStack_c8,(mutex_type *)workListMutex);
    std::condition_variable::notify_all();
    while( true ) {
      __args = local_98.nextIndex;
      if (local_98.maxIndex <= local_98.nextIndex && local_98.activeWorkers == 0) break;
      local_98.nextIndex = local_98.chunkSize + local_98.nextIndex;
      lVar2 = local_98.nextIndex;
      if (local_98.maxIndex < local_98.nextIndex) {
        lVar2 = local_98.maxIndex;
      }
      if (local_98.maxIndex <= local_98.nextIndex) {
        workList = local_98.next;
      }
      local_98.activeWorkers = local_98.activeWorkers + 1;
      local_98.nextIndex = lVar2;
      std::unique_lock<std::mutex>::unlock(&uStack_c8);
      for (; __args < lVar2; __args = __args + 1) {
        if (local_98.func1D.super__Function_base._M_manager == (_Manager_type)0x0) {
          std::function<void_(phyr::Point2<int>)>::operator()
                    (&local_98.func2D,
                     (Point2<int>)
                     (__args % (long)local_98.nX & 0xffffffffU | __args / (long)local_98.nX << 0x20)
                    );
        }
        else {
          std::function<void_(long)>::operator()(&local_98.func1D,__args);
        }
      }
      std::unique_lock<std::mutex>::lock(&uStack_c8);
      local_98.activeWorkers = local_98.activeWorkers + -1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&uStack_c8);
    ParallelForLoop::~ParallelForLoop(&local_98);
  }
  return;
}

Assistant:

void ParallelFor(std::function<void(int64_t)> func, int64_t count, int chunkSize) {
    ASSERT(threads.size() > 0 || maxThreadIndex() == 1);

    // Run iterations immediately if not using threads or if _count_ is small
    if (threads.empty() || count < chunkSize) {
        for (int64_t i = 0; i < count; ++i) func(i);
        return;
    }

    // Create and enqueue _ParallelForLoop_ for this loop
    ParallelForLoop loop(std::move(func), count, chunkSize);
    workListMutex.lock();
    loop.next = workList;
    workList = &loop;
    workListMutex.unlock();

    // Notify worker threads of work to be done
    std::unique_lock<std::mutex> lock(workListMutex);
    workListCondition.notify_all();

    // Help out with parallel loop iterations in the current thread
    while (!loop.finished()) {
        // Run a chunk of loop iterations for _loop_

        // Find the set of loop iterations to run next
        int64_t indexStart = loop.nextIndex;
        int64_t indexEnd = std::min(indexStart + loop.chunkSize, loop.maxIndex);

        // Update _loop_ to reflect iterations this thread will run
        loop.nextIndex = indexEnd;
        if (loop.nextIndex == loop.maxIndex) workList = loop.next;
        loop.activeWorkers++;

        // Run loop indices in _[indexStart, indexEnd)_
        lock.unlock();
        for (int64_t index = indexStart; index < indexEnd; ++index) {
            if (loop.func1D) {
                loop.func1D(index);
            }
            // Handle other types of loops
            else {
                ASSERT(loop.func2D);
                loop.func2D(Point2i(index % loop.nX, index / loop.nX));
            }
        }
        lock.lock();

        // Update _loop_ to reflect completion of iterations
        loop.activeWorkers--;
    }
}